

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

bool __thiscall
el::base::TypedConfigurations::unsafeGetConfigByVal<bool>
          (TypedConfigurations *this,Level level,
          unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
          *confMap,char *confName)

{
  undefined1 uVar1;
  __node_base_ptr p_Var2;
  mapped_type *pmVar3;
  key_type local_10;
  Level local_c;
  
  local_c = level;
  p_Var2 = utils::std::
           _Hashtable<el::Level,_std::pair<const_el::Level,_bool>,_std::allocator<std::pair<const_el::Level,_bool>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&confMap->_M_h,(ulong)level % (confMap->_M_h)._M_bucket_count,&local_c,
                      (ulong)level);
  if ((p_Var2 == (__node_base_ptr)0x0) || (p_Var2->_M_nxt == (_Hash_node_base *)0x0)) {
    local_10 = Global;
    pmVar3 = utils::std::__detail::
             _Map_base<el::Level,_std::pair<const_el::Level,_bool>,_std::allocator<std::pair<const_el::Level,_bool>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<el::Level,_std::pair<const_el::Level,_bool>,_std::allocator<std::pair<const_el::Level,_bool>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)confMap,&local_10);
    uVar1 = *pmVar3;
  }
  else {
    uVar1 = *(undefined1 *)((long)&p_Var2->_M_nxt[1]._M_nxt + 4);
  }
  return (bool)uVar1;
}

Assistant:

Conf_T unsafeGetConfigByVal(Level level, const std::unordered_map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::unordered_map<Level, Conf_T>::const_iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
        return Conf_T();
      }
    }
    return it->second;
  }